

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFExpression::Operation::print
          (Operation *this,raw_ostream *OS,DWARFExpression *Expr,MCRegisterInfo *RegInfo,
          DWARFUnit *U,bool isEH)

{
  bool bVar1;
  byte bVar2;
  Encoding EVar3;
  DWARFAbbreviationDeclaration *pDVar4;
  char *pcVar5;
  uint8_t uVar6;
  uint uVar7;
  Optional<unsigned_int> OVar8;
  raw_ostream *OS_00;
  size_t sVar9;
  void *__buf;
  uint RegNum;
  char *__s;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  StringRef SVar13;
  Optional<const_char_*> OVar14;
  StringRef Str;
  StringRef Str_00;
  undefined1 local_c0 [8];
  DWARFDie Die;
  undefined1 local_90 [8];
  Optional<llvm::DWARFFormValue> Name;
  
  bVar1 = this->Error;
  if (bVar1 == true) {
    __s = "<decoding error>";
    sVar9 = 0x10;
LAB_00d8a280:
    Str.Length = sVar9;
    Str.Data = __s;
    raw_ostream::operator<<(OS,Str);
  }
  else {
    SVar13 = dwarf::OperationEncodingString((uint)this->Opcode);
    if (SVar13.Length == 0) {
      __assert_fail("!Name.empty() && \"DW_OP has no name!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                    ,0xf8,
                    "bool llvm::DWARFExpression::Operation::print(raw_ostream &, const DWARFExpression *, const MCRegisterInfo *, DWARFUnit *, bool)"
                   );
    }
    raw_ostream::operator<<(OS,SVar13);
    bVar2 = this->Opcode;
    uVar7 = (uint)bVar2;
    if ((((byte)(bVar2 + 0xb0) < 0x40) || ((uVar7 | 2) == 0x92)) &&
       (RegInfo != (MCRegisterInfo *)0x0)) {
      if ((uVar7 | 2) == 0x92) {
        RegNum = (uint)this->Operands[0];
        lVar11 = 1;
      }
      else {
        if ((byte)(bVar2 + 0x90) < 0x22) {
          RegNum = uVar7 - 0x70;
        }
        else {
          RegNum = uVar7 - 0x50;
        }
        lVar11 = 0;
      }
      OVar8 = MCRegisterInfo::getLLVMRegNum(RegInfo,RegNum,isEH);
      if (((ulong)OVar8.Storage & 0x100000000) != 0) {
        if (RegInfo->NumRegs <= OVar8.Storage.field_0.value) {
          __assert_fail("RegNo < NumRegs && \"Attempting to access record for invalid register number!\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/MC/MCRegisterInfo.h"
                        ,0x14b,
                        "const MCRegisterDesc &llvm::MCRegisterInfo::operator[](MCRegister) const");
        }
        if (RegInfo->RegStrings != (char *)0x0) {
          __s = RegInfo->RegStrings + RegInfo->Desc[(ulong)OVar8.Storage & 0xffffffff].Name;
          bVar12 = 0x1f < (byte)(uVar7 - 0x70);
          if (uVar7 == 0x92 || !bVar12) {
            Name.Storage.field_0._0_8_ = anon_var_dwarf_428ffca;
            local_90 = (undefined1  [8])&PTR_home_010982d0;
            Name.Storage.field_0.value.Value.field_0 =
                 *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + lVar11);
            Name.Storage.field_0.value.Value.data = (uint8_t *)__s;
            raw_ostream::operator<<(OS,(format_object_base *)local_90);
            goto LAB_00d8a69e;
          }
          pcVar5 = OS->OutBufCur;
          if (pcVar5 < OS->OutBufEnd) {
            OS->OutBufCur = pcVar5 + 1;
            *pcVar5 = ' ';
          }
          else {
            OS = (raw_ostream *)
                 raw_ostream::write(OS,0x20,__buf,(ulong)CONCAT31((int3)(uVar7 - 0x70 >> 8),bVar12))
            ;
          }
          sVar9 = strlen(__s);
          goto LAB_00d8a280;
        }
      }
    }
    Die.Die = (DWARFDebugInfoEntry *)&PTR_home_01098098;
    lVar11 = 0;
    Name.Storage._48_8_ = OS;
    do {
      EVar3 = (this->Desc).Op[lVar11];
      if (EVar3 == SizeNA) break;
      if ((U == (DWARFUnit *)0x0) || (EVar3 != BaseTypeRef)) {
        if (EVar3 == SizeBlock) {
          local_c0 = (undefined1  [8])this->Operands[lVar11];
          uVar7 = (int)lVar11 - 1;
          OS = (raw_ostream *)Name.Storage._48_8_;
          if (this->Operands[uVar7] != 0) {
            uVar10 = 1;
            do {
              uVar6 = DataExtractor::getU8(&Expr->Data,(uint64_t *)local_c0,(Error *)0x0);
              Name.Storage.field_0._0_8_ = anon_var_dwarf_4289425;
              local_90 = (undefined1  [8])Die.Die;
              Name.Storage.field_0._8_1_ = uVar6;
              raw_ostream::operator<<
                        ((raw_ostream *)Name.Storage._48_8_,(format_object_base *)local_90);
              bVar12 = uVar10 < this->Operands[uVar7];
              OS = (raw_ostream *)Name.Storage._48_8_;
              uVar10 = (ulong)((int)uVar10 + 1);
            } while (bVar12);
          }
        }
        else {
          if ((char)EVar3 < '\0') {
            Name.Storage.field_0.value.Value.field_0 =
                 *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + lVar11);
            Name.Storage.field_0._0_8_ = anon_var_dwarf_41accef;
            local_90 = (undefined1  [8])&PTR_home_010984c8;
          }
          else {
            if ((this->Opcode == 0xa3) || (this->Opcode == 0xf3)) goto LAB_00d8a68e;
            Name.Storage.field_0._0_8_ = (long)"cu + 0x%lx" + 4;
            local_90 = (undefined1  [8])&PTR_home_01097f70;
            Name.Storage.field_0.value.Value.field_0 =
                 *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + lVar11);
          }
          raw_ostream::operator<<(OS,(format_object_base *)local_90);
        }
      }
      else {
        _local_c0 = DWARFUnit::getDIEForOffset(U,this->Operands[lVar11] + (U->Header).Offset);
        if (((local_c0._8_8_ == (DWARFDebugInfoEntry *)0x0 || local_c0 == (DWARFUnit *)0x0) ||
            (pDVar4 = (local_c0._8_8_)->AbbrevDecl, pDVar4 == (DWARFAbbreviationDeclaration *)0x0))
           || (pDVar4->Tag != DW_TAG_base_type)) {
          Name.Storage.field_0._0_8_ = anon_var_dwarf_428941a;
          local_90 = (undefined1  [8])&PTR_home_01097f70;
          Name.Storage.field_0.value.Value.field_0 =
               *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + lVar11);
          raw_ostream::operator<<(OS,(format_object_base *)local_90);
        }
        else {
          Name.Storage.field_0.value.Value.field_0 =
               (anon_union_8_3_82d75f4a_for_ValueType_0)
               (this->Operands[lVar11] + (U->Header).Offset);
          Name.Storage.field_0._0_8_ = anon_var_dwarf_42893d5;
          local_90 = (undefined1  [8])&PTR_home_01097f70;
          raw_ostream::operator<<(OS,(format_object_base *)local_90);
          OS = (raw_ostream *)Name.Storage._48_8_;
          DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,(DWARFDie *)local_c0,DW_AT_name)
          ;
          if (Name.Storage.field_0._40_1_ == '\x01') {
            SVar13.Length = 2;
            SVar13.Data = " \"";
            OS_00 = raw_ostream::operator<<(OS,SVar13);
            if (Name.Storage.field_0._40_1_ == '\0') {
              __assert_fail("hasVal",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                            ,0xad,
                            "T &llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue>::getValue() & [T = llvm::DWARFFormValue]"
                           );
            }
            OVar14 = DWARFFormValue::getAsCString((DWARFFormValue *)local_90);
            if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            {
              llvm::operator<<(OS_00,None);
            }
            else {
              raw_ostream::operator<<(OS_00,OVar14.Storage.field_0.value);
            }
            Str_00.Length = 1;
            Str_00.Data = "\"";
            raw_ostream::operator<<(OS_00,Str_00);
          }
        }
      }
LAB_00d8a68e:
      bVar12 = lVar11 == 0;
      lVar11 = lVar11 + 1;
    } while (bVar12);
  }
LAB_00d8a69e:
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool DWARFExpression::Operation::print(raw_ostream &OS,
                                       const DWARFExpression *Expr,
                                       const MCRegisterInfo *RegInfo,
                                       DWARFUnit *U,
                                       bool isEH) {
  if (Error) {
    OS << "<decoding error>";
    return false;
  }

  StringRef Name = OperationEncodingString(Opcode);
  assert(!Name.empty() && "DW_OP has no name!");
  OS << Name;

  if ((Opcode >= DW_OP_breg0 && Opcode <= DW_OP_breg31) ||
      (Opcode >= DW_OP_reg0 && Opcode <= DW_OP_reg31) ||
      Opcode == DW_OP_bregx || Opcode == DW_OP_regx)
    if (prettyPrintRegisterOp(OS, Opcode, Operands, RegInfo, isEH))
      return true;

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];
    unsigned Signed = Size & Operation::SignBit;

    if (Size == Operation::SizeNA)
      break;

    if (Size == Operation::BaseTypeRef && U) {
      auto Die = U->getDIEForOffset(U->getOffset() + Operands[Operand]);
      if (Die && Die.getTag() == dwarf::DW_TAG_base_type) {
        OS << format(" (0x%08" PRIx64 ")", U->getOffset() + Operands[Operand]);
        if (auto Name = Die.find(dwarf::DW_AT_name))
          OS << " \"" << Name->getAsCString() << "\"";
      } else {
        OS << format(" <invalid base_type ref: 0x%" PRIx64 ">",
                     Operands[Operand]);
      }
    } else if (Size == Operation::SizeBlock) {
      uint64_t Offset = Operands[Operand];
      for (unsigned i = 0; i < Operands[Operand - 1]; ++i)
        OS << format(" 0x%02x", Expr->Data.getU8(&Offset));
    } else {
      if (Signed)
        OS << format(" %+" PRId64, (int64_t)Operands[Operand]);
      else if (Opcode != DW_OP_entry_value &&
               Opcode != DW_OP_GNU_entry_value)
        OS << format(" 0x%" PRIx64, Operands[Operand]);
    }
  }
  return true;
}